

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_element.c
# Opt level: O2

void apx_dataElement_set_type_ref_id(apx_dataElement_t *self,apx_typeId_t type_id)

{
  apx_typeCode_t aVar1;
  
  if (self != (apx_dataElement_t *)0x0) {
    aVar1 = self->type_code;
    if (aVar1 == '\x11') {
      free((self->type_ref).name);
      aVar1 = self->type_code;
    }
    if (aVar1 != '\x10') {
      self->type_code = '\x10';
    }
    (self->type_ref).id = type_id;
  }
  return;
}

Assistant:

void apx_dataElement_set_type_ref_id(apx_dataElement_t* self, apx_typeId_t type_id)
{
   if (self != 0)
   {
      if ( (self->type_code == APX_TYPE_CODE_REF_NAME) && (self->type_ref.name != 0) )
      {
         free(self->type_ref.name);
      }
      if (self->type_code != APX_TYPE_CODE_REF_ID)
      {
         self->type_code = APX_TYPE_CODE_REF_ID;
      }
      self->type_ref.id = type_id;
   }
}